

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void release_char_sheet_config(void)

{
  int local_c;
  wchar_t i;
  
  if (cached_config != (char_sheet_config *)0x0) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      mem_free(cached_config->resists_by_region[local_c]);
    }
    mem_free(cached_config->stat_mod_entries);
    mem_free(cached_config);
    cached_config = (char_sheet_config *)0x0;
  }
  return;
}

Assistant:

static void release_char_sheet_config(void)
{
	int i;

	if (!cached_config) {
		return;
	}
	for (i = 0; i < 4; ++i) {
		mem_free(cached_config->resists_by_region[i]);
	}
	mem_free(cached_config->stat_mod_entries);
	mem_free(cached_config);
	cached_config = 0;
}